

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

TableInstanceInfo * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::getTableInstanceInfo
          (TableInstanceInfo *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          Name name)

{
  Table *pTVar1;
  mapped_type *pmVar2;
  Export *pEVar3;
  char *pcVar4;
  variant<wasm::Name,_wasm::HeapType> *pvVar5;
  size_t sVar6;
  Name name_00;
  
  pcVar4 = name.super_IString.str._M_str;
  sVar6 = name.super_IString.str._M_len;
  while( true ) {
    name_00.super_IString.str._M_str = pcVar4;
    name_00.super_IString.str._M_len = sVar6;
    pTVar1 = Module::getTable(this->wasm,name_00);
    if ((pTVar1->super_Importable).module.super_IString.str._M_str == (char *)0x0) break;
    pmVar2 = std::
             map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
             ::at(&this->linkedInstances,&(pTVar1->super_Importable).module);
    pEVar3 = Module::getExport((((pmVar2->
                                 super___shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2>)
                                ._M_ptr)->super_ModuleRunnerBase<wasm::ModuleRunner>).wasm,
                               (Name)(pTVar1->super_Importable).base.super_IString.str);
    this = &((pmVar2->super___shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_ModuleRunnerBase<wasm::ModuleRunner>;
    pvVar5 = &pEVar3->value;
    if (*(__index_type *)
         ((long)&(pEVar3->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
                 super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                 super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                 super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                 super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                 super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 0x10) != '\0') {
      pvVar5 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
    }
    sVar6 = *(size_t *)
             &(pvVar5->super__Variant_base<wasm::Name,_wasm::HeapType>).
              super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
              super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
              super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
              super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
              super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u;
    pcVar4 = *(char **)((long)&(pvVar5->super__Variant_base<wasm::Name,_wasm::HeapType>).
                               super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                               super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                               super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                               super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                               super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u + 8);
  }
  __return_storage_ptr__->instance = (ModuleRunner *)this;
  (__return_storage_ptr__->name).super_IString.str._M_len = sVar6;
  (__return_storage_ptr__->name).super_IString.str._M_str = pcVar4;
  return __return_storage_ptr__;
}

Assistant:

TableInstanceInfo getTableInstanceInfo(Name name) {
    auto* table = wasm.getTable(name);
    if (table->imported()) {
      auto& importedInstance = linkedInstances.at(table->module);
      auto* tableExport = importedInstance->wasm.getExport(table->base);
      return importedInstance->getTableInstanceInfo(
        *tableExport->getInternalName());
    }

    return TableInstanceInfo{self(), name};
  }